

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wcssub.c
# Opt level: O0

int fits_read_wcstab(fitsfile *fptr,int nwtb,wtbarr *wtb,int *status)

{
  int iVar1;
  void *pvVar2;
  int *in_RCX;
  char *in_RDX;
  int in_ESI;
  fitsfile *in_RDI;
  undefined4 unaff_retaddr;
  int unaff_retaddr_00;
  fitsfile *in_stack_00000008;
  int in_stack_00000014;
  wtbarr *wtbp;
  long nelem;
  long *naxes;
  int nostat;
  int naxis;
  int m;
  int iwtb;
  int hdunum;
  int colnum;
  int anynul;
  char *local_60;
  size_t local_58;
  size_t *local_50;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffcc;
  int *in_stack_ffffffffffffffd0;
  char *templt;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar3;
  
  if (*in_RCX == 0) {
    if (in_RDI == (fitsfile *)0x0) {
      *in_RCX = 0x73;
      iVar3 = 0x73;
    }
    else if (in_ESI == 0) {
      iVar3 = 0;
    }
    else {
      local_60 = in_RDX;
      for (iVar3 = 0; iVar3 < in_ESI; iVar3 = iVar3 + 1) {
        **(undefined8 **)(local_60 + 0xc0) = 0;
        local_60 = local_60 + 200;
      }
      local_60 = in_RDX;
      ffghdn(in_RDI,(int *)&stack0xffffffffffffffcc);
      iVar3 = 0;
      templt = local_60;
      while( true ) {
        local_50 = (size_t *)0x0;
        if (((in_ESI <= iVar3) ||
            (iVar1 = ffmnhd((fitsfile *)wtbp,in_stack_00000014,(char *)in_stack_00000008,
                            unaff_retaddr_00,
                            (int *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)),
            iVar1 != 0)) ||
           (iVar1 = ffgcno(in_RDI,in_ESI,templt,in_RCX,in_stack_ffffffffffffffd0), iVar1 != 0))
        goto LAB_0026cc85;
        if (*(int *)(local_60 + 0xb0) < 1) break;
        local_50 = (size_t *)calloc((long)*(int *)(local_60 + 0xb0),8);
        if (local_50 == (size_t *)0x0) {
          *in_RCX = 0x71;
          goto LAB_0026cc85;
        }
        iVar1 = ffgtdm((fitsfile *)wtb,status._4_4_,(int)status,_colnum,_iwtb,_naxis);
        if (iVar1 != 0) goto LAB_0026cc85;
        if (in_stack_ffffffffffffffc0 != *(int *)(local_60 + 0xb0)) {
          if ((*(int *)(local_60 + 8) != 99) || (*(int *)(local_60 + 0xb0) != 2)) {
            *in_RCX = 0x107;
            goto LAB_0026cc85;
          }
          in_stack_ffffffffffffffc0 = 2;
          local_50[1] = *local_50;
          *local_50 = 1;
        }
        if (*(int *)(local_60 + 8) == 99) {
          local_58 = *local_50;
          for (in_stack_ffffffffffffffc4 = 0;
              in_stack_ffffffffffffffc4 < in_stack_ffffffffffffffc0 + -1;
              in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffc4 + 1) {
            *(int *)(*(long *)(local_60 + 0xb8) + (long)in_stack_ffffffffffffffc4 * 4) =
                 (int)local_50[in_stack_ffffffffffffffc4 + 1];
            local_58 = local_50[in_stack_ffffffffffffffc4 + 1] * local_58;
          }
        }
        else {
          local_58 = *local_50;
          if (local_58 != (long)**(int **)(local_60 + 0xb8)) {
            *in_RCX = 0x107;
            goto LAB_0026cc85;
          }
        }
        free(local_50);
        local_50 = (size_t *)0x0;
        pvVar2 = calloc(local_58,8);
        **(undefined8 **)(local_60 + 0xc0) = pvVar2;
        if (pvVar2 == (void *)0x0) {
          *in_RCX = 0x71;
          goto LAB_0026cc85;
        }
        iVar1 = ffgcvd((fitsfile *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                       (int)((ulong)templt >> 0x20),(LONGLONG)in_RCX,
                       (LONGLONG)in_stack_ffffffffffffffd0,CONCAT44(in_stack_ffffffffffffffcc,iVar3)
                       ,(double)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       (double *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                       (int *)CONCAT44(unaff_retaddr_00,unaff_retaddr),
                       &in_stack_00000008->HDUposition);
        if (iVar1 != 0) goto LAB_0026cc85;
        iVar3 = iVar3 + 1;
        local_60 = local_60 + 200;
      }
      *in_RCX = 0x143;
LAB_0026cc85:
      ffmahd(in_stack_00000008,unaff_retaddr_00,
             (int *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
             &in_RDI->HDUposition);
      local_60 = templt;
      if (local_50 != (size_t *)0x0) {
        free(local_50);
        local_60 = templt;
      }
      if (*in_RCX != 0) {
        for (iVar3 = 0; iVar3 < in_ESI; iVar3 = iVar3 + 1) {
          if (**(long **)(local_60 + 0xc0) != 0) {
            free((void *)**(undefined8 **)(local_60 + 0xc0));
          }
          local_60 = local_60 + 200;
        }
      }
      iVar3 = *in_RCX;
    }
  }
  else {
    iVar3 = *in_RCX;
  }
  return iVar3;
}

Assistant:

int fits_read_wcstab(
   fitsfile   *fptr, /* I - FITS file pointer           */
   int  nwtb,        /* Number of arrays to be read from the binary table(s) */
   wtbarr *wtb,      /* Address of the first element of an array of wtbarr
                         typedefs.  This wtbarr typedef is defined below to
                         match the wtbarr struct defined in WCSLIB.  An array
                         of such structs returned by the WCSLIB function
                         wcstab(). */
   int  *status)

/*
*   Author: Mark Calabretta, Australia Telescope National Facility
*   http://www.atnf.csiro.au/~mcalabre/index.html
*
*   fits_read_wcstab() extracts arrays from a binary table required in
*   constructing -TAB coordinates.  This helper routine is intended for
*   use by routines in the WCSLIB library when dealing with the -TAB table
*   look up WCS convention.
*/

{
   int  anynul, colnum, hdunum, iwtb, m, naxis, nostat;
   long *naxes = 0, nelem;
   wtbarr *wtbp;


   if (*status) return *status;

   if (fptr == 0) {
      return (*status = NULL_INPUT_PTR);
   }

   if (nwtb == 0) return 0;

   /* Zero the array pointers. */
   wtbp = wtb;
   for (iwtb = 0; iwtb < nwtb; iwtb++, wtbp++) {
     *wtbp->arrayp = 0x0;
   }

   /* Save HDU number so that we can move back to it later. */
   fits_get_hdu_num(fptr, &hdunum);

   wtbp = wtb;
   for (iwtb = 0; iwtb < nwtb; iwtb++, wtbp++) {
      /* Move to the required binary table extension. */
      if (fits_movnam_hdu(fptr, BINARY_TBL, (char *)(wtbp->extnam),
          wtbp->extver, status)) {
         goto cleanup;
      }

      /* Locate the table column. */
      if (fits_get_colnum(fptr, CASEINSEN, (char *)(wtbp->ttype), &colnum,
          status)) {
         goto cleanup;
      }

      /* Get the array dimensions and check for consistency. */
      if (wtbp->ndim < 1) {
         *status = NEG_AXIS;
         goto cleanup;
      }

      if (!(naxes = calloc(wtbp->ndim, sizeof(long)))) {
         *status = MEMORY_ALLOCATION;
         goto cleanup;
      }

      if (fits_read_tdim(fptr, colnum, wtbp->ndim, &naxis, naxes, status)) {
         goto cleanup;
      }

      if (naxis != wtbp->ndim) {
         if (wtbp->kind == 'c' && wtbp->ndim == 2) {
            /* Allow TDIMn to be omitted for degenerate coordinate arrays. */
            naxis = 2;
            naxes[1] = naxes[0];
            naxes[0] = 1;
         } else {
            *status = BAD_TDIM;
            goto cleanup;
         }
      }

      if (wtbp->kind == 'c') {
         /* Coordinate array; calculate the array size. */
         nelem = naxes[0];
         for (m = 0; m < naxis-1; m++) {
            *(wtbp->dimlen + m) = naxes[m+1];
            nelem *= naxes[m+1];
         }
      } else {
         /* Index vector; check length. */
         if ((nelem = naxes[0]) != *(wtbp->dimlen)) {
            /* N.B. coordinate array precedes the index vectors. */
            *status = BAD_TDIM;
            goto cleanup;
         }
      }

      free(naxes);
      naxes = 0;

      /* Allocate memory for the array. */
      if (!(*wtbp->arrayp = calloc((size_t)nelem, sizeof(double)))) {
         *status = MEMORY_ALLOCATION;
         goto cleanup;
      }

      /* Read the array from the table. */
      if (fits_read_col_dbl(fptr, colnum, wtbp->row, 1L, nelem, 0.0,
          *wtbp->arrayp, &anynul, status)) {
         goto cleanup;
      }
   }

cleanup:
   /* Move back to the starting HDU. */
   nostat = 0;
   fits_movabs_hdu(fptr, hdunum, 0, &nostat);

   /* Release allocated memory. */
   if (naxes) free(naxes);
   if (*status) {
      wtbp = wtb;
      for (iwtb = 0; iwtb < nwtb; iwtb++, wtbp++) {
         if (*wtbp->arrayp) free(*wtbp->arrayp);
      }
   }

   return *status;
}